

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

bool __thiscall SQArray::Get(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQString *pSVar1;
  SQUnsignedInteger SVar2;
  SQObjectPtr *pSVar3;
  SQUnsignedInteger in_RSI;
  long in_RDI;
  SQObjectPtr *o;
  SQSharedState *obj;
  SQTable *this_00;
  
  if ((-1 < (long)in_RSI) &&
     (SVar2 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 0x30)),
     (long)in_RSI < (long)SVar2)) {
    pSVar3 = sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(in_RDI + 0x30),in_RSI);
    if ((pSVar3->super_SQObject)._type == OT_WEAKREF) {
      pSVar1 = (pSVar3->super_SQObject)._unVal.pString;
      obj = pSVar1->_sharedstate;
      this_00 = (SQTable *)pSVar1->_next;
    }
    else {
      obj = *(SQSharedState **)&pSVar3->super_SQObject;
      this_00 = (pSVar3->super_SQObject)._unVal.pTable;
    }
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObject *)obj);
    return true;
  }
  return false;
}

Assistant:

bool Get(const SQInteger nidx,SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            SQObjectPtr &o = _values[nidx];
            val = _realval(o);
            return true;
        }
        else return false;
    }